

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O3

void __thiscall
DOCTEST_ANON_SUITE_2::throw_on_move::throw_on_move(throw_on_move *this,throw_on_move *param_1)

{
  runtime_error *this_00;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined2 local_28;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40 = &local_30;
  local_30 = 0xb0d0bad0bed09fd0;
  local_28 = 0x21;
  local_38 = 9;
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

throw_on_move (throw_on_move &&)
        {
            throw std::runtime_error(u8"Пока!"_u8s);
        }